

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecCore.c
# Opt level: O0

Vec_Int_t * Acec_CountRemap(Gia_Man_t *pAdd,Gia_Man_t *pBase)

{
  int iVar1;
  int c;
  Vec_Int_t *p;
  Gia_Obj_t *pGVar2;
  bool bVar3;
  int iObjRepr;
  Gia_Obj_t *pObjBase;
  int iObjBase;
  Vec_Int_t *vMapNew;
  Gia_Obj_t *pGStack_20;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pBase_local;
  Gia_Man_t *pAdd_local;
  
  iVar1 = Gia_ManObjNum(pAdd);
  p = Vec_IntStartFull(iVar1);
  Gia_ManSetPhase(pAdd);
  Vec_IntWriteEntry(p,0,0);
  vMapNew._4_4_ = 0;
  while( true ) {
    bVar3 = false;
    if (vMapNew._4_4_ < pAdd->nObjs) {
      pGStack_20 = Gia_ManObj(pAdd,vMapNew._4_4_);
      bVar3 = pGStack_20 != (Gia_Obj_t *)0x0;
    }
    if (!bVar3) break;
    iVar1 = Gia_ObjIsCand(pGStack_20);
    if (iVar1 != 0) {
      iVar1 = Abc_Lit2Var(pGStack_20->Value);
      pGVar2 = Gia_ManObj(pBase,iVar1);
      iVar1 = Abc_Lit2Var(pGVar2->Value);
      c = Gia_ObjPhase(pGStack_20);
      iVar1 = Abc_Var2Lit(iVar1,c);
      Vec_IntWriteEntry(p,vMapNew._4_4_,iVar1);
    }
    vMapNew._4_4_ = vMapNew._4_4_ + 1;
  }
  return p;
}

Assistant:

Vec_Int_t * Acec_CountRemap( Gia_Man_t * pAdd, Gia_Man_t * pBase )
{
    Gia_Obj_t * pObj; int i;
    Vec_Int_t * vMapNew = Vec_IntStartFull( Gia_ManObjNum(pAdd) );
    Gia_ManSetPhase( pAdd );
    Vec_IntWriteEntry( vMapNew, 0, 0 );
    Gia_ManForEachCand( pAdd, pObj, i )
    {
        int iObjBase = Abc_Lit2Var(pObj->Value);
        Gia_Obj_t * pObjBase = Gia_ManObj( pBase, iObjBase );
        int iObjRepr = Abc_Lit2Var(pObjBase->Value);
        Vec_IntWriteEntry( vMapNew, i, Abc_Var2Lit(iObjRepr, Gia_ObjPhase(pObj)) );
    }
    return vMapNew;
}